

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O2

bool __thiscall
trompeloeil::
call_matcher<float_&(float_&),_std::tuple<trompeloeil::predicate_matcher<trompeloeil::lambdas::equal,_trompeloeil::lambdas::equal_printer,_trompeloeil::typed_matcher<float_&>,_float>_>_>
::match_conditions(call_matcher<float_&(float_&),_std::tuple<trompeloeil::predicate_matcher<trompeloeil::lambdas::equal,_trompeloeil::lambdas::equal_printer,_trompeloeil::typed_matcher<float_&>,_float>_>_>
                   *this,call_params_type_t<float_&(float_&)> *params)

{
  list_elem<trompeloeil::condition_base<float_&(float_&)>_> *plVar1;
  int iVar2;
  condition_base<float_&(float_&)> *c;
  
  plVar1 = &(this->conditions).super_list_elem<trompeloeil::condition_base<float_&(float_&)>_>;
  do {
    plVar1 = plVar1->next;
    if (plVar1 == &(this->conditions).
                   super_list_elem<trompeloeil::condition_base<float_&(float_&)>_>) break;
    iVar2 = (*plVar1->_vptr_list_elem[2])(plVar1,params);
  } while ((char)iVar2 != '\0');
  return plVar1 == &(this->conditions).
                    super_list_elem<trompeloeil::condition_base<float_&(float_&)>_>;
}

Assistant:

bool
    match_conditions(
      call_params_type_t<Sig> const & params)
    const
    {
      // std::all_of() is almost always preferable. The only reason
      // for using a hand rolled loop is because it cuts compilation
      // times quite noticeably (almost 10% with g++5.1)
      for (auto& c : conditions)
      {
        if (!c.check(params)) return false;
      }
      return true;
    }